

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Bool coda_XML_SetBillionLaughsAttackProtectionMaximumAmplification
                   (XML_Parser parser,float maximumAmplificationFactor)

{
  float maximumAmplificationFactor_local;
  XML_Parser parser_local;
  
  if (((parser == (XML_Parser)0x0) || (parser->m_parentParser != (XML_Parser)0x0)) ||
     (maximumAmplificationFactor < 1.0)) {
    parser_local._7_1_ = '\0';
  }
  else {
    (parser->m_accounting).maximumAmplificationFactor = maximumAmplificationFactor;
    parser_local._7_1_ = '\x01';
  }
  return parser_local._7_1_;
}

Assistant:

XML_Bool XMLCALL
XML_SetBillionLaughsAttackProtectionMaximumAmplification(
    XML_Parser parser, float maximumAmplificationFactor) {
  if ((parser == NULL) || (parser->m_parentParser != NULL)
      || isnan(maximumAmplificationFactor)
      || (maximumAmplificationFactor < 1.0f)) {
    return XML_FALSE;
  }
  parser->m_accounting.maximumAmplificationFactor = maximumAmplificationFactor;
  return XML_TRUE;
}